

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_table_column_metadata
              (sqlite3 *db,char *zDbName,char *zTableName,char *zColumnName,char **pzDataType,
              char **pzCollSeq,int *pNotNull,int *pPrimaryKey,int *pAutoinc)

{
  long lVar1;
  int iVar2;
  char *in_RCX;
  undefined8 in_RDX;
  char *zFormat;
  sqlite3 *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  uint *in_stack_00000008;
  uint *in_stack_00000010;
  uint *in_stack_00000018;
  int autoinc;
  int primarykey;
  int notnull;
  char *zCollSeq;
  char *zDataType;
  int iCol;
  Column *pCol;
  Table *pTab;
  int rc;
  char *zErrMsg;
  sqlite3 *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  uint uVar3;
  sqlite3 *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *local_70;
  char *local_68;
  int local_5c;
  sqlite3 *local_58;
  Table *local_50;
  uint local_44;
  char *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (char *)0x0;
  local_50 = (Table *)0x0;
  local_58 = (sqlite3 *)0x0;
  local_5c = 0;
  local_68 = (char *)0x0;
  local_70 = (char *)0x0;
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  sqlite3_mutex_enter((sqlite3_mutex *)0x14e18e);
  sqlite3BtreeEnterAll((sqlite3 *)0x14e19b);
  local_44 = sqlite3Init(in_stack_ffffffffffffff78,
                         (char **)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (local_44 == 0) {
    local_50 = sqlite3FindTable((sqlite3 *)CONCAT44(uVar6,uVar5),
                                (char *)CONCAT44(uVar4,in_stack_ffffffffffffff80),
                                (char *)in_stack_ffffffffffffff78);
    if ((local_50 == (Table *)0x0) || (local_50->eTabType == '\x02')) {
      local_50 = (Table *)0x0;
    }
    else {
      if (in_RCX != (char *)0x0) {
        for (local_5c = 0; local_5c < local_50->nCol; local_5c = local_5c + 1) {
          local_58 = (sqlite3 *)(local_50->aCol + local_5c);
          iVar2 = sqlite3StrICmp((char *)local_58->pVfs,in_RCX);
          if (iVar2 == 0) break;
        }
        if (local_5c == local_50->nCol) {
          if (((local_50->tabFlags & 0x80) != 0) ||
             (iVar2 = sqlite3IsRowid((char *)in_stack_ffffffffffffff68), iVar2 == 0)) {
            local_50 = (Table *)0x0;
            goto LAB_0014e3bd;
          }
          local_5c = (int)local_50->iPKey;
          if (local_5c < 0) {
            in_stack_ffffffffffffff78 = (sqlite3 *)0x0;
            local_58 = in_stack_ffffffffffffff78;
          }
          else {
            in_stack_ffffffffffffff78 = (sqlite3 *)(local_50->aCol + local_5c);
            local_58 = in_stack_ffffffffffffff78;
          }
        }
      }
      if (local_58 == (sqlite3 *)0x0) {
        local_68 = "INTEGER";
        uVar5 = 1;
      }
      else {
        local_68 = sqlite3ColumnType((Column *)in_stack_ffffffffffffff78,
                                     (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                      in_stack_ffffffffffffff70));
        local_70 = sqlite3ColumnColl((Column *)local_58);
        uVar6 = (uint)(((ulong)local_58->pVdbe & 0xf) != 0);
        uVar5 = (uint)(((ulong)local_58->pVdbe & 0x1000000000000) != 0);
        uVar3 = in_stack_ffffffffffffff74 & 0xffffff;
        if (local_50->iPKey == local_5c) {
          uVar3 = CONCAT13((local_50->tabFlags & 8) != 0,(int3)in_stack_ffffffffffffff74);
        }
        uVar4 = uVar3 >> 0x18;
        in_stack_ffffffffffffff74 = uVar3;
      }
      if (local_70 == (char *)0x0) {
        local_70 = "BINARY";
      }
    }
  }
LAB_0014e3bd:
  sqlite3BtreeLeaveAll((sqlite3 *)0x14e3ca);
  if (in_R8 != (undefined8 *)0x0) {
    *in_R8 = local_68;
  }
  if (in_R9 != (undefined8 *)0x0) {
    *in_R9 = local_70;
  }
  if (in_stack_00000008 != (uint *)0x0) {
    *in_stack_00000008 = uVar6;
  }
  if (in_stack_00000010 != (uint *)0x0) {
    *in_stack_00000010 = uVar5;
  }
  if (in_stack_00000018 != (uint *)0x0) {
    *in_stack_00000018 = uVar4;
  }
  if ((local_44 == 0) && (local_50 == (Table *)0x0)) {
    sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                  in_stack_ffffffffffffff68);
    local_10 = sqlite3MPrintf(in_RDI,"no such table column: %s.%s",in_RDX,in_RCX);
    local_44 = 1;
  }
  zFormat = "%s";
  if (local_10 == (char *)0x0) {
    zFormat = (char *)0x0;
  }
  sqlite3ErrorWithMsg(in_RDI,(int)(ulong)local_44,zFormat);
  sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                in_stack_ffffffffffffff68);
  iVar2 = sqlite3ApiExit(in_stack_ffffffffffffff68,0);
  sqlite3_mutex_leave((sqlite3_mutex *)0x14e4f8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_table_column_metadata(
  sqlite3 *db,                /* Connection handle */
  const char *zDbName,        /* Database name or NULL */
  const char *zTableName,     /* Table name */
  const char *zColumnName,    /* Column name */
  char const **pzDataType,    /* OUTPUT: Declared data type */
  char const **pzCollSeq,     /* OUTPUT: Collation sequence name */
  int *pNotNull,              /* OUTPUT: True if NOT NULL constraint exists */
  int *pPrimaryKey,           /* OUTPUT: True if column part of PK */
  int *pAutoinc               /* OUTPUT: True if column is auto-increment */
){
  int rc;
  char *zErrMsg = 0;
  Table *pTab = 0;
  Column *pCol = 0;
  int iCol = 0;
  char const *zDataType = 0;
  char const *zCollSeq = 0;
  int notnull = 0;
  int primarykey = 0;
  int autoinc = 0;


#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTableName==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif

  /* Ensure the database schema has been loaded */
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  rc = sqlite3Init(db, &zErrMsg);
  if( SQLITE_OK!=rc ){
    goto error_out;
  }

  /* Locate the table in question */
  pTab = sqlite3FindTable(db, zTableName, zDbName);
  if( !pTab || IsView(pTab) ){
    pTab = 0;
    goto error_out;
  }

  /* Find the column for which info is requested */
  if( zColumnName==0 ){
    /* Query for existence of table only */
  }else{
    for(iCol=0; iCol<pTab->nCol; iCol++){
      pCol = &pTab->aCol[iCol];
      if( 0==sqlite3StrICmp(pCol->zCnName, zColumnName) ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      if( HasRowid(pTab) && sqlite3IsRowid(zColumnName) ){
        iCol = pTab->iPKey;
        pCol = iCol>=0 ? &pTab->aCol[iCol] : 0;
      }else{
        pTab = 0;
        goto error_out;
      }
    }
  }

  /* The following block stores the meta information that will be returned
  ** to the caller in local variables zDataType, zCollSeq, notnull, primarykey
  ** and autoinc. At this point there are two possibilities:
  **
  **     1. The specified column name was rowid", "oid" or "_rowid_"
  **        and there is no explicitly declared IPK column.
  **
  **     2. The table is not a view and the column name identified an
  **        explicitly declared column. Copy meta information from *pCol.
  */
  if( pCol ){
    zDataType = sqlite3ColumnType(pCol,0);
    zCollSeq = sqlite3ColumnColl(pCol);
    notnull = pCol->notNull!=0;
    primarykey  = (pCol->colFlags & COLFLAG_PRIMKEY)!=0;
    autoinc = pTab->iPKey==iCol && (pTab->tabFlags & TF_Autoincrement)!=0;
  }else{
    zDataType = "INTEGER";
    primarykey = 1;
  }
  if( !zCollSeq ){
    zCollSeq = sqlite3StrBINARY;
  }

error_out:
  sqlite3BtreeLeaveAll(db);

  /* Whether the function call succeeded or failed, set the output parameters
  ** to whatever their local counterparts contain. If an error did occur,
  ** this has the effect of zeroing all output parameters.
  */
  if( pzDataType ) *pzDataType = zDataType;
  if( pzCollSeq ) *pzCollSeq = zCollSeq;
  if( pNotNull ) *pNotNull = notnull;
  if( pPrimaryKey ) *pPrimaryKey = primarykey;
  if( pAutoinc ) *pAutoinc = autoinc;

  if( SQLITE_OK==rc && !pTab ){
    sqlite3DbFree(db, zErrMsg);
    zErrMsg = sqlite3MPrintf(db, "no such table column: %s.%s", zTableName,
        zColumnName);
    rc = SQLITE_ERROR;
  }
  sqlite3ErrorWithMsg(db, rc, (zErrMsg?"%s":0), zErrMsg);
  sqlite3DbFree(db, zErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}